

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deh261.c
# Opt level: O2

int main(void)

{
  uint32_t uVar1;
  int iVar2;
  int iVar3;
  ulong in_RAX;
  uint8_t *bytes;
  bitstream *str;
  h261_picparm *picparm;
  h261_gob *gob;
  long lVar4;
  bool bVar5;
  ulong uStack_38;
  uint32_t start_code;
  
  lVar4 = 0;
  iVar3 = 0;
  bytes = (uint8_t *)0x0;
  uStack_38 = in_RAX;
  while (iVar2 = getchar(), iVar2 != -1) {
    if (iVar3 <= lVar4) {
      bVar5 = iVar3 == 0;
      iVar3 = iVar3 * 2;
      if (bVar5) {
        iVar3 = 0x10;
      }
      bytes = (uint8_t *)realloc(bytes,(long)iVar3);
    }
    bytes[lVar4] = (uint8_t)iVar2;
    lVar4 = lVar4 + 1;
  }
  str = vs_new_decode(VS_H261,bytes,(int)lVar4);
  picparm = (h261_picparm *)calloc(8,1);
  do {
    while (iVar3 = vs_start(str,&start_code), iVar3 != 0) {
LAB_00101260:
      iVar3 = vs_search_start(str);
      if (iVar3 == 0) {
        return 0;
      }
      if (iVar3 == -1) {
        return 1;
      }
      putchar(10);
    }
    printf("Start code: %02x\n",uStack_38 >> 0x20);
    uVar1 = start_code;
    if (start_code != 0) {
      if (start_code < 0xd) {
        gob = (h261_gob *)calloc(0xc89c,1);
        gob->gn = uVar1;
        iVar3 = h261_gob(str,gob);
        h261_print_gob(gob);
        h261_del_gob(gob);
        if (iVar3 == 0) goto LAB_001012f7;
      }
      else {
        fprintf(_stderr,"Invalid start code %d\n",(ulong)start_code);
      }
      goto LAB_00101260;
    }
    iVar3 = h261_picparm(str,picparm);
    if (iVar3 != 0) goto LAB_00101260;
    h261_print_picparm(picparm);
LAB_001012f7:
    puts("NAL decoded successfully\n");
  } while( true );
}

Assistant:

int main() {
	uint8_t *bytes = 0;
	int bytesnum = 0;
	int bytesmax = 0;
	int c;
	int res;
	while ((c = getchar()) != EOF) {
		ADDARRAY(bytes, c);
	}
	struct bitstream *str = vs_new_decode(VS_H261, bytes, bytesnum);
	struct h261_picparm *picparm = calloc(sizeof *picparm, 1);
	while (1) {
		uint32_t start_code;
		if (vs_start(str, &start_code)) goto err;
		printf("Start code: %02x\n", start_code);
		if (start_code == 0) {
			if (h261_picparm(str, picparm)) goto err;
			h261_print_picparm(picparm);
		} else if (start_code <= 12) {
			struct h261_gob *gob = calloc (sizeof *gob, 1);
			gob->gn = start_code;
			if (h261_gob(str, gob)) {
				h261_print_gob(gob);
				h261_del_gob(gob);
				goto err;
			}
			h261_print_gob(gob);
			h261_del_gob(gob);
		} else {
			fprintf(stderr, "Invalid start code %d\n", start_code);
			goto err;
		}
		printf("NAL decoded successfully\n\n");
		continue;
err:
		res = vs_search_start(str);
		if (res == -1)
			return 1;
		if (!res)
			break;
		printf("\n");
	}
	return 0;
}